

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_image_load(nifti_image *nim)

{
  znzFile fp_00;
  void *dataptr;
  size_t sVar1;
  ulong __size;
  znzFile fp;
  
  fp_00 = nifti_image_load_prep(nim);
  fp = fp_00;
  if (fp_00 == (znzFile)0x0) {
    if (0 < g_opts_0) {
      fwrite("** nifti_image_load, failed load_prep\n",0x26,1,_stderr);
      return -1;
    }
    return -1;
  }
  __size = (long)nim->nbyper * nim->nvox;
  dataptr = nim->data;
  if (dataptr == (void *)0x0) {
    dataptr = calloc(1,__size);
    nim->data = dataptr;
    if (dataptr == (void *)0x0) {
      if (0 < g_opts_0) {
        fprintf(_stderr,"** failed to alloc %d bytes for image data\n",__size & 0xffffffff);
      }
      Xznzclose(&fp);
      return -1;
    }
  }
  sVar1 = nifti_read_buffer(fp_00,dataptr,__size,nim);
  Xznzclose(&fp);
  if (sVar1 < __size) {
    free(nim->data);
    nim->data = (void *)0x0;
    return -1;
  }
  return 0;
}

Assistant:

int nifti_image_load( nifti_image *nim )
{
   /* set up data space, open data file and seek, then call nifti_read_buffer */
   size_t ntot , ii ;
   znzFile fp ;

   /**- open the file and position the FILE pointer */
   fp = nifti_image_load_prep( nim );

   if( fp == NULL ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** nifti_image_load, failed load_prep\n");
      return -1;
   }

   ntot = nifti_get_volsize(nim);

   /**- if the data pointer is not yet set, get memory space for the image */

   if( nim->data == NULL )
   {
     nim->data = (void *)calloc(1,ntot) ;  /* create image memory */
     if( nim->data == NULL ){
        if( g_opts.debug > 0 )
           fprintf(stderr,"** failed to alloc %d bytes for image data\n",
                   (int)ntot);
        znzclose(fp);
        return -1;
     }
   }

   /**- now that everything is set up, do the reading */
   ii = nifti_read_buffer(fp,nim->data,ntot,nim);
   if( ii < ntot ){
      znzclose(fp) ;
      free(nim->data) ;
      nim->data = NULL ;
      return -1 ;  /* errors were printed in nifti_read_buffer() */
   }

   /**- close the file */
   znzclose( fp ) ;

   return 0 ;
}